

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_oload(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  char arg2 [4608];
  char arg1 [4608];
  
  pcVar4 = one_argument(argument,arg1);
  one_argument(pcVar4,arg2);
  pcVar4 = "Syntax: load obj <vnum> <level>.\n\r";
  if ((arg1[0] == '\0') || (bVar1 = is_number(arg1), !bVar1)) goto LAB_002cb634;
  iVar2 = get_trust(ch);
  if (arg2[0] != '\0') {
    bVar1 = is_number(arg2);
    if (!bVar1) {
      pcVar4 = "Syntax: oload <vnum> <level>.\n\r";
      goto LAB_002cb634;
    }
    iVar2 = atoi(arg2);
    pcVar4 = "Level must be be between 0 and your level.\n\r";
    if ((iVar2 < 0) || (iVar3 = get_trust(ch), iVar3 < iVar2)) goto LAB_002cb634;
  }
  iVar3 = atoi(arg1);
  pObjIndex = get_obj_index(iVar3);
  if (pObjIndex == (OBJ_INDEX_DATA *)0x0) {
    pcVar4 = "No object has that vnum.\n\r";
  }
  else {
    obj = create_object(pObjIndex,iVar2);
    bVar1 = can_wear(obj,0);
    if (bVar1) {
      obj_to_char(obj,ch);
    }
    else {
      obj_to_room(obj,ch->in_room);
    }
    act("$n has created $p!",ch,obj,(void *)0x0,(uint)(0x32 < ch->invis_level) * 5);
    iVar2 = get_trust(ch);
    wiznet("$N loads $p.",ch,obj,0x10,0xc,iVar2);
    pcVar4 = "Ok.\n\r";
  }
LAB_002cb634:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_oload(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pObjIndex;
	OBJ_DATA *obj;
	int level;

	argument = one_argument(argument, arg1);
	one_argument(argument, arg2);

	if (arg1[0] == '\0' || !is_number(arg1))
	{
		send_to_char("Syntax: load obj <vnum> <level>.\n\r", ch);
		return;
	}

	level = get_trust(ch); /* default */

	if (arg2[0] != '\0') /* load with a level */
	{
		if (!is_number(arg2))
		{
			send_to_char("Syntax: oload <vnum> <level>.\n\r", ch);
			return;
		}

		level = atoi(arg2);

		if (level < 0 || level > get_trust(ch))
		{
			send_to_char("Level must be be between 0 and your level.\n\r", ch);
			return;
		}
	}

	pObjIndex = get_obj_index(atoi(arg1));

	if (pObjIndex == nullptr)
	{
		send_to_char("No object has that vnum.\n\r", ch);
		return;
	}

	obj = create_object(pObjIndex, level);

	if (can_wear(obj, ITEM_TAKE))
		obj_to_char(obj, ch);
	else
		obj_to_room(obj, ch->in_room);

	act("$n has created $p!", ch, obj, nullptr, ch->invis_level > 50 ? TO_IMMINROOM : TO_ROOM);

	wiznet("$N loads $p.", ch, obj, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	send_to_char("Ok.\n\r", ch);
}